

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_test_suite.cpp
# Opt level: O3

vector<char,_std::allocator<char>_> *
anon_unknown.dwarf_202996::read_bytes
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,string *filename)

{
  size_type __new_size;
  vector<char,_std::allocator<char>_> *pvVar1;
  AssertionHandler catchAssertionHandler;
  ifstream is;
  StringRef local_2a8;
  AssertionHandler local_298;
  StringRef local_250;
  SourceLineInfo local_240;
  basic_ifstream<char,_std::char_traits<char>_> local_230 [520];
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(local_230,(string *)filename,_S_bin);
  local_2a8.m_start = "REQUIRE";
  local_2a8.m_size = 7;
  local_240.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_test_suite.cpp"
  ;
  local_240.line = 0x16;
  Catch::StringRef::StringRef(&local_250,"is");
  Catch::AssertionHandler::AssertionHandler(&local_298,&local_2a8,&local_240,local_250,Normal);
  local_2a8.m_start = (char *)local_230;
  Catch::AssertionHandler::handleExpr<std::ifstream_const&>
            (&local_298,
             (ExprLhs<const_std::basic_ifstream<char,_std::char_traits<char>_>_&> *)&local_2a8);
  Catch::AssertionHandler::complete(&local_298);
  if (local_298.m_completed == false) {
    (*(local_298.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  std::istream::seekg((long)local_230,_S_beg);
  __new_size = std::istream::tellg();
  std::istream::seekg((long)local_230,_S_beg);
  std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,__new_size);
  std::istream::read((char *)local_230,
                     (long)(__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)
                           ._M_impl.super__Vector_impl_data._M_start);
  std::ifstream::close();
  pvVar1 = (vector<char,_std::allocator<char>_> *)std::ifstream::~ifstream(local_230);
  return pvVar1;
}

Assistant:

std::vector<char> read_bytes(const std::string& filename)
    {
        std::vector<char> bytes;
        std::ifstream is(filename, std::ifstream::binary);
        REQUIRE(is);
        is.seekg (0, is.end);
        std::streamoff length = is.tellg();
        is.seekg (0, is.beg);
        bytes.resize(static_cast<std::size_t>(length));
        is.read(bytes.data(), static_cast<std::size_t>(length));
        is.close();
        return bytes;
    }